

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ssl_setup_extension_permutation(SSL_HANDSHAKE *hs)

{
  uchar uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  uchar *puVar5;
  long lVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  uint32_t seeds [27];
  uint local_88 [28];
  long lVar9;
  
  if ((hs->config->field_0x10e & 4) == 0) {
    return true;
  }
  iVar4 = RAND_bytes((uchar *)local_88,0x6c);
  if (iVar4 != 0) {
    OPENSSL_free((void *)0x0);
    puVar5 = (uchar *)OPENSSL_malloc(0x1c);
    auVar3 = _DAT_00229330;
    if (puVar5 != (uchar *)0x0) {
      lVar6 = 0;
      auVar8 = _DAT_00229320;
      do {
        if (SUB164(auVar8 ^ auVar3,4) == -0x80000000 && SUB164(auVar8 ^ auVar3,0) < -0x7fffffe4) {
          puVar5[lVar6] = (uchar)lVar6;
          puVar5[lVar6 + 1] = (uchar)lVar6 + '\x01';
        }
        lVar6 = lVar6 + 2;
        lVar9 = auVar8._8_8_;
        auVar8._0_8_ = auVar8._0_8_ + 2;
        auVar8._8_8_ = lVar9 + 2;
      } while (lVar6 != 0x1c);
      lVar6 = 0x1b;
      do {
        uVar2 = (ulong)local_88[lVar6 + -1] % (ulong)((int)lVar6 + 1);
        uVar1 = puVar5[lVar6];
        puVar5[lVar6] = puVar5[uVar2];
        puVar5[uVar2] = uVar1;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
      OPENSSL_free((hs->extension_permutation).data_);
      (hs->extension_permutation).data_ = puVar5;
      (hs->extension_permutation).size_ = 0x1c;
      bVar7 = true;
      goto LAB_001361f9;
    }
  }
  bVar7 = false;
LAB_001361f9:
  OPENSSL_free((void *)0x0);
  return bVar7;
}

Assistant:

bool ssl_setup_extension_permutation(SSL_HANDSHAKE *hs) {
  if (!hs->config->permute_extensions) {
    return true;
  }

  static_assert(kNumExtensions <= UINT8_MAX,
                "extensions_permutation type is too small");
  uint32_t seeds[kNumExtensions - 1];
  Array<uint8_t> permutation;
  if (!RAND_bytes(reinterpret_cast<uint8_t *>(seeds), sizeof(seeds)) ||
      !permutation.InitForOverwrite(kNumExtensions)) {
    return false;
  }
  for (size_t i = 0; i < kNumExtensions; i++) {
    permutation[i] = i;
  }
  for (size_t i = kNumExtensions - 1; i > 0; i--) {
    // Set element |i| to a randomly-selected element 0 <= j <= i.
    std::swap(permutation[i], permutation[seeds[i - 1] % (i + 1)]);
  }
  hs->extension_permutation = std::move(permutation);
  return true;
}